

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void a__GLTextureBind(AGLTexture *texture,GLint unit)

{
  AGLTexture *mutable_texture;
  GLint unit_local;
  AGLTexture *texture_local;
  
  glActiveTexture(unit + 0x84c0);
  glBindTexture(0xde1,(texture->_).name);
  if ((texture->_).min_filter != texture->min_filter) {
    glTexParameteri(0xde1,0x2801,texture->min_filter);
    (texture->_).min_filter = texture->min_filter;
  }
  if ((texture->_).mag_filter != texture->mag_filter) {
    glTexParameteri(0xde1,0x2800,texture->mag_filter);
    (texture->_).mag_filter = texture->mag_filter;
  }
  if ((texture->_).wrap_s != texture->wrap_s) {
    glTexParameteri(0xde1,0x2802,texture->wrap_s);
    (texture->_).wrap_s = texture->wrap_s;
  }
  if ((texture->_).wrap_t != texture->wrap_t) {
    glTexParameteri(0xde1,0x2803,texture->wrap_t);
    (texture->_).wrap_t = texture->wrap_t;
  }
  return;
}

Assistant:

static void a__GLTextureBind(const AGLTexture *texture, GLint unit) {
	ATTO_GL_PROFILE_START
	AGL__CALL(glActiveTexture(GL_TEXTURE0 + unit));
	AGL__CALL(glBindTexture(GL_TEXTURE_2D, texture->_.name));

	AGLTexture *mutable_texture = (AGLTexture *)texture;
	if (mutable_texture->_.min_filter != (GLenum)mutable_texture->min_filter) {
		AGL__CALL(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, mutable_texture->min_filter));
		mutable_texture->_.min_filter = (GLenum)mutable_texture->min_filter;
	}
	if (mutable_texture->_.mag_filter != (GLenum)mutable_texture->mag_filter) {
		AGL__CALL(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, mutable_texture->mag_filter));
		mutable_texture->_.mag_filter = (GLenum)mutable_texture->mag_filter;
	}
	if (mutable_texture->_.wrap_s != (GLenum)mutable_texture->wrap_s) {
		AGL__CALL(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, mutable_texture->wrap_s));
		mutable_texture->_.wrap_s = (GLenum)mutable_texture->wrap_s;
	}
	if (mutable_texture->_.wrap_t != (GLenum)mutable_texture->wrap_t) {
		AGL__CALL(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, mutable_texture->wrap_t));
		mutable_texture->_.wrap_t = (GLenum)mutable_texture->wrap_t;
	}
	ATTO_GL_PROFILE_END
}